

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populate
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  logic_error *this_00;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> vStack_38;
  
  if (((this->m_options).
       super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->m_options).
       super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"No options or arguments specified");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  populateOptions(__return_storage_ptr__,this,tokens,config);
  populateFixedArgs(&vStack_38,this,__return_storage_ptr__,config);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::_M_move_assign
            (__return_storage_ptr__,&vStack_38);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(&vStack_38);
  populateFloatingArgs(&vStack_38,this,__return_storage_ptr__,config);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::_M_move_assign
            (__return_storage_ptr__,&vStack_38);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(&vStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populate( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( m_options.empty() && m_positionalArgs.empty() )
                throw std::logic_error( "No options or arguments specified" );

            std::vector<Parser::Token> unusedTokens = populateOptions( tokens, config );
            unusedTokens = populateFixedArgs( unusedTokens, config );
            unusedTokens = populateFloatingArgs( unusedTokens, config );
            return unusedTokens;
        }